

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O1

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::
     spinlocking_heterogeneous_queue_put_transaction_samples(void)

{
  LfQueueControl *pLVar1;
  uintptr_t uVar2;
  void *pvVar3;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *psVar4;
  bool bVar5;
  int *piVar6;
  runtime_type<> *prVar7;
  type_info *ptVar8;
  size_t sVar9;
  double *pdVar10;
  char *pcVar11;
  put_transaction<int> transaction1;
  type transaction2;
  int msg_2;
  time_point start_time;
  int value_2;
  int msg_1;
  put_transaction<void> transaction;
  Allocation __tmp;
  Allocation __tmp_1;
  Allocation __tmp_2;
  Allocation __tmp_3;
  put_transaction<int> local_260;
  put_transaction<int> local_240;
  double local_218;
  put_transaction<int> local_210;
  int local_1e4;
  put_transaction<int> local_1e0;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  local_1c0;
  put_transaction<int> local_110 [7];
  
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_1e0.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<int,int>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_1c0,(int *)&local_1e0);
  local_210.m_put.m_control_block = local_240.m_put.m_control_block;
  local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_210.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  local_260.m_put.m_control_block = local_210.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
  local_260.m_queue = local_210.m_queue;
  local_210.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_210);
  local_240.m_put.m_control_block = local_260.m_put.m_control_block;
  local_240.m_put.m_next_ptr = local_260.m_put.m_next_ptr;
  local_240.m_put.m_user_storage = local_260.m_put.m_user_storage;
  local_240.m_queue = local_260.m_queue;
  local_260.m_put.m_user_storage = (void *)0x0;
  piVar6 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                  ::put_transaction<int>::element_ptr(&local_240);
  if (*piVar6 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x153,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::commit(&local_240);
  if (local_240.m_put.m_user_storage != (void *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x157,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_260);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_1e0.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<int,int>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_1c0,(int *)&local_1e0);
  local_210.m_put.m_control_block = local_240.m_put.m_control_block;
  local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_210.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  local_260.m_put.m_control_block = local_210.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
  local_260.m_queue = local_210.m_queue;
  local_210.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_210);
  psVar4 = local_240.m_queue;
  uVar2 = local_240.m_put.m_next_ptr;
  pLVar1 = local_240.m_put.m_control_block;
  local_240.m_put.m_control_block = local_260.m_put.m_control_block;
  local_240.m_put.m_next_ptr = local_260.m_put.m_next_ptr;
  local_240.m_put.m_user_storage = local_260.m_put.m_user_storage;
  local_260.m_put.m_user_storage = (void *)0x0;
  local_260.m_put.m_control_block = pLVar1;
  local_260.m_put.m_next_ptr = uVar2;
  local_240.m_queue = local_260.m_queue;
  local_260.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_240);
  if (local_240.m_put.m_user_storage != (void *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x189,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_260);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_260.m_put.m_control_block = (LfQueueControl *)&local_1c0;
  local_210.m_put.m_control_block = (LfQueueControl *)std::chrono::_V2::system_clock::now();
  local_1e0.m_put.m_control_block._0_4_ = 0x2a;
  local_218._0_4_ = 0x237;
  local_240.m_put.m_control_block = (LfQueueControl *)&local_1c0;
  local_240.m_put.m_next_ptr = (uintptr_t)&local_210;
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_260,&local_1e0,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_260,&local_218,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            ((anon_class_16_2_e5d92710 *)&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_260.m_put.m_control_block = (LfQueueControl *)&local_1c0;
  local_210.m_put.m_control_block = (LfQueueControl *)std::chrono::_V2::system_clock::now();
  local_1e0.m_put.m_control_block._0_4_ = 0x2a;
  local_218._0_4_ = 0x237;
  local_240.m_put.m_control_block = (LfQueueControl *)&local_1c0;
  local_240.m_put.m_next_ptr = (uintptr_t)&local_210;
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_260,&local_1e0,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_260,&local_218,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            ((anon_class_16_2_e5d92710 *)&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_260.m_put.m_user_storage = (void *)0x0;
  local_1e0.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<int,int>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_1c0,(int *)&local_1e0);
  local_210.m_put.m_control_block = local_240.m_put.m_control_block;
  local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_210.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  psVar4 = local_260.m_queue;
  pvVar3 = local_260.m_put.m_user_storage;
  uVar2 = local_260.m_put.m_next_ptr;
  pLVar1 = local_260.m_put.m_control_block;
  local_260.m_put.m_control_block = local_210.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
  local_260.m_queue = local_210.m_queue;
  local_210.m_put.m_control_block = pLVar1;
  local_210.m_put.m_next_ptr = uVar2;
  local_210.m_put.m_user_storage = pvVar3;
  local_210.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_210);
  if (local_260.m_put.m_user_storage == (void *)0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x27b,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_260);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_260.m_put.m_user_storage = (void *)0x0;
  local_1e0.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<int,int>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_1c0,(int *)&local_1e0);
  local_210.m_put.m_control_block = local_240.m_put.m_control_block;
  local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_210.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  psVar4 = local_260.m_queue;
  pvVar3 = local_260.m_put.m_user_storage;
  uVar2 = local_260.m_put.m_next_ptr;
  pLVar1 = local_260.m_put.m_control_block;
  local_260.m_put.m_control_block = local_210.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
  local_260.m_queue = local_210.m_queue;
  local_210.m_put.m_control_block = pLVar1;
  local_210.m_put.m_next_ptr = uVar2;
  local_210.m_put.m_user_storage = pvVar3;
  local_210.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_210);
  if (local_260.m_put.m_user_storage == (void *)0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x289,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_260);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_1c0);
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_1c0.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1c0.m_head = (ControlBlock *)0x0;
  local_240.m_put.m_user_storage = (void *)0x0;
  local_240.m_put.m_control_block = (LfQueueControl *)0x0;
  local_240.m_put.m_next_ptr = 0;
  bVar5 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::is_queue_empty((Consume *)&local_240,&local_1c0);
  if (!bVar5) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x294,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  local_1e0.m_put.m_control_block._0_4_ = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<int,int>
            (&local_240,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_1c0,(int *)&local_1e0);
  local_210.m_put.m_control_block = local_240.m_put.m_control_block;
  local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
  local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
  local_210.m_queue = local_240.m_queue;
  local_240.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  local_260.m_put.m_control_block = local_210.m_put.m_control_block;
  local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
  local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
  local_260.m_queue = local_210.m_queue;
  local_210.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_210);
  if (local_260.m_put.m_user_storage == (void *)0x0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x298,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::cancel(&local_260);
  local_240.m_put.m_control_block = (LfQueueControl *)0x0;
  local_240.m_put.m_next_ptr = 0;
  local_240.m_put.m_user_storage = (void *)0x0;
  bVar5 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::is_queue_empty((Consume *)&local_240,&local_1c0);
  if ((bVar5) && (local_260.m_put.m_user_storage == (void *)0x0)) {
    local_1e0.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_1e0.m_put.m_control_block._4_4_,0x2a);
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::start_emplace<int,int>
              (&local_240,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_1c0,(int *)&local_1e0);
    local_210.m_put.m_control_block = local_240.m_put.m_control_block;
    local_210.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
    local_210.m_put.m_user_storage = local_240.m_put.m_user_storage;
    local_210.m_queue = local_240.m_queue;
    local_240.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::~put_transaction(&local_240);
    psVar4 = local_260.m_queue;
    pvVar3 = local_260.m_put.m_user_storage;
    uVar2 = local_260.m_put.m_next_ptr;
    pLVar1 = local_260.m_put.m_control_block;
    local_260.m_put.m_control_block = local_210.m_put.m_control_block;
    local_260.m_put.m_next_ptr = local_210.m_put.m_next_ptr;
    local_260.m_put.m_user_storage = local_210.m_put.m_user_storage;
    local_260.m_queue = local_210.m_queue;
    local_210.m_put.m_control_block = pLVar1;
    local_210.m_put.m_next_ptr = uVar2;
    local_210.m_put.m_user_storage = pvVar3;
    local_210.m_queue = psVar4;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::~put_transaction(&local_210);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::commit(&local_260);
    local_240.m_put.m_user_storage = (void *)0x0;
    local_240.m_put.m_control_block = (LfQueueControl *)0x0;
    local_240.m_put.m_next_ptr = 0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
    ::Consume::start_consume_impl((Consume *)&local_240,&local_1c0);
    piVar6 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::consume_operation::element<int>((consume_operation *)&local_240);
    if (*piVar6 != 0x2a) {
      __assert_fail("queue.try_start_consume().template element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x29f,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                   );
    }
    if ((void *)0xf < local_240.m_put.m_user_storage) {
      LOCK();
      *(ulong *)local_240.m_put.m_next_ptr = (long)local_240.m_put.m_user_storage - 2;
      UNLOCK();
      local_240.m_put.m_user_storage = (void *)0x0;
    }
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::~put_transaction(&local_260);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                       *)&local_1c0);
    local_1c0.
    super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
    .m_tail = (ControlBlock *)0xffc0;
    LOCK();
    local_1c0.
    super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
    .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
    UNLOCK();
    local_1c0.
    super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_1c0.m_head = (ControlBlock *)0x0;
    local_218 = (double)CONCAT44(local_218._4_4_,0x2a);
    local_210.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::start_dyn_push_copy
              ((put_transaction<void> *)&local_240,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                *)&local_1c0,(runtime_type *)&local_210,&local_218);
    local_260.m_put.m_control_block = local_240.m_put.m_control_block;
    local_260.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
    local_260.m_put.m_user_storage = local_240.m_put.m_user_storage;
    local_260.m_queue = local_240.m_queue;
    local_240.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_240);
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                    ::put_transaction<void>::element_ptr((put_transaction<void> *)&local_260);
    if (*piVar6 != 0x2a) {
      __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x2ab,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
    prVar7 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::put_transaction<void>::complete_type((put_transaction<void> *)&local_260);
    ptVar8 = density::runtime_type<>::type_info(prVar7);
    pcVar11 = *(char **)(ptVar8 + 8) + (**(char **)(ptVar8 + 8) == '*');
    sVar9 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<void>::commit((put_transaction<void> *)&local_260);
    local_1e4 = 1;
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::start_emplace<int,int>
              (&local_240,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_1c0,&local_1e4);
    local_1e0.m_put.m_control_block = local_240.m_put.m_control_block;
    local_1e0.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
    local_1e0.m_put.m_user_storage = local_240.m_put.m_user_storage;
    local_1e0.m_queue = local_240.m_queue;
    local_240.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::~put_transaction(&local_240);
    local_210.m_put.m_control_block = local_1e0.m_put.m_control_block;
    local_210.m_put.m_next_ptr = local_1e0.m_put.m_next_ptr;
    local_210.m_put.m_user_storage = local_1e0.m_put.m_user_storage;
    local_210.m_queue = local_1e0.m_queue;
    local_1e0.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::~put_transaction(&local_1e0);
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                    ::put_transaction<int>::element_ptr(&local_210);
    if (*piVar6 != 1) {
      __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x2b2,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                   );
    }
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                    ::put_transaction<int>::element_ptr(&local_210);
    if (*piVar6 == 1) {
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<int>::commit(&local_210);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<int>::~put_transaction(&local_210);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_260);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                         *)&local_1c0);
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_tail = (ControlBlock *)0xffc0;
      LOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
      UNLOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_1c0.m_head = (ControlBlock *)0x0;
      local_1e0.m_put.m_control_block =
           (LfQueueControl *)CONCAT44(local_1e0.m_put.m_control_block._4_4_,0x2a);
      local_210.m_put.m_control_block =
           (LfQueueControl *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
           ::s_table;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::start_dyn_push_copy
                ((put_transaction<void> *)&local_260,
                 (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                  *)&local_1c0,(runtime_type *)&local_210,&local_1e0);
      local_240.m_put.m_control_block = local_260.m_put.m_control_block;
      local_240.m_put.m_next_ptr = local_260.m_put.m_next_ptr;
      local_240.m_put.m_user_storage = local_260.m_put.m_user_storage;
      local_240.m_queue = local_260.m_queue;
      local_260.m_put.m_user_storage = (void *)0x0;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_260);
      prVar7 = density::
               sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<void>::complete_type((put_transaction<void> *)&local_240);
      if (prVar7->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("put.complete_type().template is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                      ,0x2c0,
                      "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                     );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
      prVar7 = density::
               sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<void>::complete_type((put_transaction<void> *)&local_240);
      ptVar8 = density::runtime_type<>::type_info(prVar7);
      pcVar11 = *(char **)(ptVar8 + 8) + (**(char **)(ptVar8 + 8) == '*');
      sVar9 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_240);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                         *)&local_1c0);
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_tail = (ControlBlock *)0xffc0;
      LOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
      UNLOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_1c0.m_head = (ControlBlock *)0x0;
      local_260.m_put.m_control_block =
           (LfQueueControl *)CONCAT44(local_260.m_put.m_control_block._4_4_,0x2a);
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
      ::start_emplace<int,int>
                (&local_240,
                 (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                  *)&local_1c0,(int *)&local_260);
      local_110[0].m_put.m_control_block = local_240.m_put.m_control_block;
      local_110[0].m_put.m_next_ptr = local_240.m_put.m_next_ptr;
      local_110[0].m_put.m_user_storage = local_240.m_put.m_user_storage;
      local_110[0].m_queue = local_240.m_queue;
      local_240.m_put.m_user_storage = (void *)0x0;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<int>::~put_transaction(&local_240);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<int>::~put_transaction(local_110);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                         *)&local_1c0);
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_tail = (ControlBlock *)0xffc0;
      LOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
      UNLOCK();
      local_1c0.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_1c0.m_head = (ControlBlock *)0x0;
      local_1e4 = 0x2a;
      local_210.m_put.m_control_block =
           (LfQueueControl *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
           ::s_table;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::start_reentrant_dyn_push_copy
                ((reentrant_put_transaction<void> *)&local_240,
                 (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                  *)&local_1c0,(runtime_type *)&local_210,&local_1e4);
      local_260.m_put.m_control_block = local_240.m_put.m_control_block;
      local_260.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
      local_260.m_put.m_user_storage = local_240.m_put.m_user_storage;
      local_260.m_queue = local_240.m_queue;
      local_240.m_put.m_user_storage = (void *)0x0;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction
                ((reentrant_put_transaction<void> *)&local_240);
      local_218 = 42.0;
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
      ::start_reentrant_emplace<double,double>
                ((reentrant_put_transaction<double> *)&local_240,
                 (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                  *)&local_1c0,&local_218);
      local_1e0.m_put.m_control_block = local_240.m_put.m_control_block;
      local_1e0.m_put.m_next_ptr = local_240.m_put.m_next_ptr;
      local_1e0.m_put.m_user_storage = local_240.m_put.m_user_storage;
      local_1e0.m_queue = local_240.m_queue;
      local_240.m_put.m_user_storage = (void *)0x0;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)&local_240);
      local_210.m_put.m_control_block = local_1e0.m_put.m_control_block;
      local_210.m_put.m_next_ptr = local_1e0.m_put.m_next_ptr;
      local_210.m_put.m_user_storage = local_1e0.m_put.m_user_storage;
      local_210.m_queue = local_1e0.m_queue;
      local_1e0.m_put.m_user_storage = (void *)0x0;
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)&local_1e0);
      pdVar10 = (double *)
                density::
                sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                ::reentrant_put_transaction<double>::element_ptr
                          ((reentrant_put_transaction<double> *)&local_210);
      if ((*pdVar10 == 42.0) && (!NAN(*pdVar10))) {
        density::
        sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        ::reentrant_put_transaction<double>::~reentrant_put_transaction
                  ((reentrant_put_transaction<double> *)&local_210);
        density::
        sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        ::reentrant_put_transaction<void>::~reentrant_put_transaction
                  ((reentrant_put_transaction<void> *)&local_260);
        density::
        sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                           *)&local_1c0);
        return;
      }
      __assert_fail("typed_put.element() == 42.",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x2df,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                   );
    }
    __assert_fail("put_1.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2b3,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  __assert_fail("queue.empty() && put.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x29a,
                "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_single>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_put_transaction_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue put_transaction default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        typename SpQueue::template put_transaction<> transaction;
        assert(transaction.empty());
        //! [sp_heter_queue put_transaction default_construct example 1]
    }
    {
        //! [sp_heter_queue put_transaction copy_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_constructible<typename SpQueue::template put_transaction<>>::value, "");
        //! [sp_heter_queue put_transaction copy_construct example 1]
    }
    {
        //! [sp_heter_queue put_transaction copy_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_assignable<typename SpQueue::template put_transaction<>>::value, "");
        //! [sp_heter_queue put_transaction copy_assign example 1]
    }
    {
        //! [sp_heter_queue put_transaction move_construct example 1]
        sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
             queue;
        auto transaction1 = queue.start_push(1);

        // move from transaction1 to transaction2
        auto transaction2(std::move(transaction1));
        assert(transaction1.empty());
        assert(transaction2.element() == 1);

        // commit transaction2
        transaction2.commit();
        assert(transaction2.empty());

        //! [sp_heter_queue put_transaction move_construct example 1]

        //! [sp_heter_queue put_transaction move_construct example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // put_transaction<void> can be move constructed from any put_transaction<T>
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");

        // put_transaction<T> can be move constructed only from put_transaction<T>
        static_assert(
          !std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue put_transaction move_construct example 2]
    }
    {
        //! [sp_heter_queue put_transaction move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_push(1);

        typename SpQueue::template put_transaction<> transaction2;
        transaction2 = std::move(transaction1);
        assert(transaction1.empty());
        transaction2.commit();
        assert(transaction2.empty());
        //! [sp_heter_queue put_transaction move_assign example 1]
    }
    {
        //! [sp_heter_queue put_transaction move_assign example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // put_transaction<void> can be move assigned from any put_transaction<T>
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");

        // put_transaction<T> can be move assigned only from put_transaction<T>
        static_assert(
          !std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue put_transaction move_assign example 2]
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            auto transaction             = queue.template start_emplace<Msg>();
            transaction.element().m_len  = i_len;
            transaction.element().m_data = transaction.raw_allocate(i_len, 1);
            memcpy(transaction.element().m_data, i_data, i_len);

            assert(
              !transaction
                 .empty()); // a put transaction is not empty if it's bound to an element being put
            transaction.commit();
            assert(transaction.empty()); // the commit makes the transaction empty
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue put_transaction raw_allocate example 1]
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction              = queue.template start_emplace<Msg>();
            transaction.element().m_len   = i_len;
            transaction.element().m_chars = transaction.raw_allocate_copy(i_data, i_data + i_len);
            memcpy(transaction.element().m_chars, i_data, i_len);
            transaction.commit();
        };
        //! [sp_heter_queue put_transaction raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction              = queue.template start_emplace<Msg>();
            transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
            transaction.commit();
        };
        //! [sp_heter_queue put_transaction raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            if (auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free))
            {
                // if we fail to allocate the raw block, we don't commit the put transaction
                transaction.element().m_len = i_len;
                transaction.element().m_data =
                  transaction.try_raw_allocate(progress_lock_free, i_len, 1);
                if (transaction.element().m_data)
                {
                    memcpy(transaction.element().m_data, i_data, i_len);

                    assert(
                      !transaction
                         .empty()); // a put transaction is not empty if it's bound to an element being put
                    transaction.commit();
                    assert(transaction.empty()); // the commit makes the transaction empty
                }
            }
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue put_transaction try_raw_allocate example 1]
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_len = i_len;
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_data, i_data + i_len);
            if (transaction.element().m_chars)
            {
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            }
        };
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_string);
            if (transaction.element().m_chars)
            {
                transaction.commit();
            }
        };
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template put_transaction<> transaction;
        assert(transaction.empty());

        transaction = queue.start_push(1);
        assert(!transaction.empty());
        //! [sp_heter_queue put_transaction empty example 1]
    }
    {
        //! [sp_heter_queue put_transaction operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template put_transaction<> transaction;
        assert(!transaction);

        transaction = queue.start_push(1);
        assert(transaction);
        //! [sp_heter_queue put_transaction operator_bool example 1]
    }
    {
        //! [sp_heter_queue put_transaction cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        // start and cancel a put
        assert(queue.empty());
        auto put = queue.start_push(42);
        /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
                the queue during a non-reentrant put transaction. */
        assert(!put.empty());
        put.cancel();
        assert(queue.empty() && put.empty());

        // start and commit a put
        put = queue.start_push(42);
        put.commit();
        assert(queue.try_start_consume().template element<int>() == 42);
        //! [sp_heter_queue put_transaction cancel example 1]
    }
    {
        //! [sp_heter_queue put_transaction element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(*static_cast<int *>(put.element_ptr()) == 42);
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        put.commit();
        //! [sp_heter_queue put_transaction element_ptr example 1]

        //! [sp_heter_queue put_transaction element_ptr example 2]
        auto put_1 = queue.start_push(1);
        assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
        assert(put_1.element() == 1);                          // this is better
        put_1.commit();
        //! [sp_heter_queue put_transaction element_ptr example 2]
    }
    {
        //! [sp_heter_queue put_transaction complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(put.complete_type().template is<int>());
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        //! [sp_heter_queue put_transaction complete_type example 1]
    }
    {
        //! [sp_heter_queue put_transaction destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.start_push(42); /* this transaction is destroyed without being committed,
                                    so it gets canceled automatically. */
        //! [sp_heter_queue put_transaction destroy example 1]
    }
    {
        //! [sp_heter_queue typed_put_transaction element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto untyped_put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

        auto typed_put = queue.start_reentrant_push(42.);

        /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
                transaction to a typed transaction */

        assert(typed_put.element() == 42.);

        //! [sp_heter_queue typed_put_transaction element example 1]
    }
}